

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshShape.cpp
# Opt level: O2

void __thiscall chrono::ChTriangleMeshShape::ChTriangleMeshShape(ChTriangleMeshShape *this)

{
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  ChVisualShape::ChVisualShape(&this->super_ChVisualShape);
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChTriangleMeshShape_0118c238
  ;
  this->wireframe = false;
  this->backface_cull = false;
  (this->trimesh).
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->trimesh).
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&this->name,"",(allocator *)&local_30);
  (this->scale).m_data[0] = 1.0;
  (this->scale).m_data[1] = 1.0;
  (this->scale).m_data[2] = 1.0;
  this->fixed_connectivity = false;
  (this->modified_vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->modified_vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modified_vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::make_shared<chrono::geometry::ChTriangleMeshConnected>();
  std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&(this->trimesh).
             super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

ChTriangleMeshShape::ChTriangleMeshShape()
    : name(""), scale(ChVector<>(1)), wireframe(false), backface_cull(false), fixed_connectivity(false) {
    trimesh = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
}